

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_channel_conversion_path
ma_channel_map_get_conversion_path
          (ma_channel *pChannelMapIn,ma_uint32 channelsIn,ma_channel *pChannelMapOut,
          ma_uint32 channelsOut,ma_channel_mix_mode mode)

{
  bool bVar1;
  ma_channel channelPosition;
  ma_bool32 mVar2;
  long lVar3;
  bool bVar4;
  
  if ((channelsOut == channelsIn) &&
     (mVar2 = ma_channel_map_is_equal(pChannelMapOut,pChannelMapIn,channelsOut), mVar2 != 0)) {
    return ma_channel_conversion_path_passthrough;
  }
  if (channelsOut == 1) {
    if (pChannelMapOut == (ma_channel *)0x0) {
      return ma_channel_conversion_path_mono_out;
    }
    if (*pChannelMapOut == '\x01') {
      return ma_channel_conversion_path_mono_out;
    }
  }
  if (channelsIn == 1) {
    if (pChannelMapIn == (ma_channel *)0x0) {
      return ma_channel_conversion_path_mono_in;
    }
    if (*pChannelMapIn == '\x01') {
      return ma_channel_conversion_path_mono_in;
    }
  }
  if (mode == ma_channel_mix_mode_custom_weights) {
    return ma_channel_conversion_path_weights;
  }
  if (channelsOut == channelsIn) {
    if (channelsIn == 0) {
      return ma_channel_conversion_path_shuffle;
    }
    bVar1 = true;
    lVar3 = 0;
    do {
      if (pChannelMapIn == (ma_channel *)0x0) {
        channelPosition =
             ma_channel_map_init_standard_channel
                       (ma_standard_channel_map_default,channelsIn,(ma_uint32)lVar3);
      }
      else {
        channelPosition = pChannelMapIn[lVar3];
      }
      mVar2 = ma_channel_map_contains_channel_position(channelsOut,pChannelMapOut,channelPosition);
      if (mVar2 == 0) {
        bVar1 = false;
        break;
      }
      bVar4 = (ulong)channelsIn - 1 != lVar3;
      lVar3 = lVar3 + 1;
    } while (bVar4);
    if (bVar1) {
      return ma_channel_conversion_path_shuffle;
    }
  }
  return ma_channel_conversion_path_weights;
}

Assistant:

static ma_channel_conversion_path ma_channel_map_get_conversion_path(const ma_channel* pChannelMapIn, ma_uint32 channelsIn, const ma_channel* pChannelMapOut, ma_uint32 channelsOut, ma_channel_mix_mode mode)
{
    if (ma_channel_map_is_passthrough(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut)) {
        return ma_channel_conversion_path_passthrough;
    }

    if (channelsOut == 1 && (pChannelMapOut == NULL || pChannelMapOut[0] == MA_CHANNEL_MONO)) {
        return ma_channel_conversion_path_mono_out;
    }

    if (channelsIn == 1 && (pChannelMapIn == NULL || pChannelMapIn[0] == MA_CHANNEL_MONO)) {
        return ma_channel_conversion_path_mono_in;
    }

    if (mode == ma_channel_mix_mode_custom_weights) {
        return ma_channel_conversion_path_weights;
    }

    /*
    We can use a simple shuffle if both channel maps have the same channel count and all channel
    positions are present in both.
    */
    if (channelsIn == channelsOut) {
        ma_uint32 iChannelIn;
        ma_bool32 areAllChannelPositionsPresent = MA_TRUE;
        for (iChannelIn = 0; iChannelIn < channelsIn; ++iChannelIn) {
            ma_bool32 isInputChannelPositionInOutput = ma_channel_map_contains_channel_position(channelsOut, pChannelMapOut, ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn));
            if (!isInputChannelPositionInOutput) {
                areAllChannelPositionsPresent = MA_FALSE;
                break;
            }
        }

        if (areAllChannelPositionsPresent) {
            return ma_channel_conversion_path_shuffle;
        }
    }

    /* Getting here means we'll need to use weights. */
    return ma_channel_conversion_path_weights;
}